

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::LoadableGetStateBlock_w
          (ChElementHexaANCF_3813_9 *this,int block_offset,ChStateDelta *mD)

{
  double *pdVar1;
  pointer psVar2;
  double *pdVar3;
  long lVar4;
  element_type *peVar5;
  element_type *peVar6;
  Index index_3;
  Index index_1;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  Index index;
  long lVar10;
  ulong uVar11;
  
  psVar2 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (mD->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  lVar4 = (mD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  pdVar7 = pdVar3 + block_offset;
  lVar8 = 0;
  do {
    if ((block_offset < 0) || (lVar10 = lVar8 * 3 + (long)block_offset, lVar4 + -3 < lVar10))
    goto LAB_006f7a31;
    pdVar1 = pdVar3 + lVar10;
    uVar11 = 3;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar11 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), 2 < uVar11)) {
      uVar11 = 3;
    }
    peVar5 = psVar2[lVar8].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (uVar11 != 0) {
      uVar9 = 0;
      do {
        pdVar7[uVar9] = *(double *)((long)&peVar5->X0 + uVar9 * 8 + 0xffffffffffffff80);
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
    }
    if (uVar11 < 3) {
      do {
        pdVar7[uVar11] = *(double *)((long)&peVar5->X0 + uVar11 * 8 + 0xffffffffffffff80);
        uVar11 = uVar11 + 1;
      } while (uVar11 != 3);
    }
    lVar8 = lVar8 + 1;
    pdVar7 = pdVar7 + 3;
  } while (lVar8 != 8);
  if ((-0x19 < block_offset) &&
     ((long)(ulong)(block_offset + 0x18) <=
      (mD->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3)) {
    pdVar7 = (mD->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             (block_offset + 0x18);
    uVar11 = 3;
    if ((((ulong)pdVar7 & 7) == 0) &&
       (uVar9 = (ulong)(-((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7), uVar9 < 3)) {
      uVar11 = uVar9;
    }
    peVar6 = (this->m_central_node).
             super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (uVar11 != 0) {
      uVar9 = 0;
      do {
        pdVar7[uVar9] = (peVar6->m_rxx_dt).m_data[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
    }
    if (uVar11 < 3) {
      do {
        pdVar7[uVar11] = (peVar6->m_rxx_dt).m_data[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar11 != 3);
    }
    if ((-0x1c < block_offset) &&
       ((long)(ulong)(block_offset + 0x1b) <=
        (mD->super_ChVectorDynamic<double>).
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3)) {
      pdVar7 = (mD->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               (block_offset + 0x1b);
      uVar11 = 3;
      if ((((ulong)pdVar7 & 7) == 0) &&
         (uVar9 = (ulong)(-((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7), uVar9 < 3)) {
        uVar11 = uVar9;
      }
      peVar6 = (this->m_central_node).
               super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (uVar11 != 0) {
        uVar9 = 0;
        do {
          pdVar7[uVar9] = (peVar6->m_ryy_dt).m_data[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
      }
      if (uVar11 < 3) {
        do {
          pdVar7[uVar11] = (peVar6->m_ryy_dt).m_data[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar11 != 3);
      }
      if ((-0x1f < block_offset) &&
         ((long)(ulong)(block_offset + 0x1e) <=
          (mD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3)) {
        pdVar7 = (mD->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 (block_offset + 0x1e);
        uVar11 = 3;
        if ((((ulong)pdVar7 & 7) == 0) &&
           (uVar9 = (ulong)(-((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7), uVar9 < 3)) {
          uVar11 = uVar9;
        }
        peVar6 = (this->m_central_node).
                 super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (uVar11 != 0) {
          uVar9 = 0;
          do {
            pdVar7[uVar9] = (peVar6->m_rzz_dt).m_data[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar11 != uVar9);
        }
        if (uVar11 < 3) {
          do {
            pdVar7[uVar11] = (peVar6->m_rzz_dt).m_data[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar11 != 3);
        }
        return;
      }
    }
  }
LAB_006f7a31:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementHexaANCF_3813_9::LoadableGetStateBlock_w(int block_offset, ChStateDelta& mD) {
    for (int i = 0; i < 8; i++) {
        mD.segment(block_offset + 3 * i, 3) = m_nodes[i]->GetPos_dt().eigen();
    }
    mD.segment(block_offset + 24, 3) = m_central_node->GetCurvatureXX_dt().eigen();
    mD.segment(block_offset + 27, 3) = m_central_node->GetCurvatureYY_dt().eigen();
    mD.segment(block_offset + 30, 3) = m_central_node->GetCurvatureZZ_dt().eigen();
}